

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Commands.cpp
# Opt level: O2

void __thiscall
DisarmC4GameCommand::trigger
          (DisarmC4GameCommand *this,Server *source,PlayerInfo *player,string_view parameters)

{
  char cVar1;
  long lVar2;
  char *pcVar3;
  basic_string_view<char,_std::char_traits<char>_> *args_2;
  undefined8 uStack_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string_view<char,_std::char_traits<char>_> local_48;
  basic_string_view<char,_std::char_traits<char>_> local_38;
  undefined8 local_28;
  char *local_20;
  
  args_2 = (basic_string_view<char,_std::char_traits<char>_> *)parameters._M_str;
  if (parameters._M_len == 0) {
    pcVar3 = "Error: Too few parameters. Syntax: disarmc4 <player>";
    uStack_70 = 0x34;
  }
  else {
    lVar2 = RenX::Server::getPlayerByPartName(source,parameters._M_len,args_2);
    if (lVar2 == 0) {
      pcVar3 = "Error: Player not found.";
      uStack_70 = 0x18;
    }
    else {
      if (player->access <= *(int *)(lVar2 + 0x1b0)) {
        local_28 = 0x27;
        local_20 = "Error: You can not disarm higher level ";
        local_38._M_len = pluginInstance.m_staffTitle._M_string_length;
        local_38._M_str = pluginInstance.m_staffTitle._M_dataplus._M_p;
        local_48._M_len = 2;
        local_48._M_str = "s.";
        jessilib::
        join<std::__cxx11::string,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>>
                  (&local_68,(jessilib *)&local_28,&local_38,&local_48,args_2);
        RenX::Server::sendMessage(source,player,local_68._M_string_length,local_68._M_dataplus._M_p)
        ;
        std::__cxx11::string::~string((string *)&local_68);
        return;
      }
      cVar1 = RenX::Server::disarmC4((PlayerInfo *)source);
      if (cVar1 == '\0') {
        pcVar3 = "Error: Server does not support disarms.";
        uStack_70 = 0x27;
      }
      else {
        pcVar3 = "Player has been disarmed.";
        uStack_70 = 0x19;
      }
    }
  }
  RenX::Server::sendMessage(source,player,uStack_70,pcVar3);
  return;
}

Assistant:

void DisarmC4GameCommand::trigger(RenX::Server *source, RenX::PlayerInfo *player, std::string_view parameters) {
	if (!parameters.empty()) {
		RenX::PlayerInfo *target = source->getPlayerByPartName(parameters);
		if (target == nullptr)
			source->sendMessage(*player, "Error: Player not found."sv);
		else if (target->access >= player->access)
			source->sendMessage(*player, jessilib::join<std::string>("Error: You can not disarm higher level "sv, pluginInstance.getStaffTitle(), "s."sv));
		else if (source->disarmC4(*target) == false)
			source->sendMessage(*player, "Error: Server does not support disarms."sv);
		else
			source->sendMessage(*player, "Player has been disarmed."sv);
	}
	else
		source->sendMessage(*player, "Error: Too few parameters. Syntax: disarmc4 <player>"sv);
}